

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O1

void dgrminer::find_addition_edges
               (AdjacencyListCrate *adjacency_list,
               vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
               *antecedent_pattern_edges_ADDED,
               map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
               *from_pattern_id_to_adj_id_map,int num_of_nondummy_nodes,
               vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
               *edge_mapping_sets,
               set<int,_std::less<int>,_std::allocator<int>_> *edges_occupied_by_antecedent,
               bool debug)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *pvVar3;
  bool bVar4;
  long *plVar5;
  ulong uVar6;
  mapped_type *pmVar7;
  pointer piVar8;
  ostream *this;
  int *piVar9;
  ulong uVar10;
  long lVar11;
  _Base_ptr p_Var12;
  _Rb_tree_header *p_Var13;
  undefined8 extraout_RDX;
  _Base_ptr p_Var14;
  int iVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  bool bVar20;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar21;
  vector<int,_std::allocator<int>_> selected_ids_from_adj;
  vector<bool,_std::allocator<bool>_> is_the_used_edge_dummy;
  set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>
  edge_mapping_set;
  int_pair edge_mapping_pair;
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  adj_more_info;
  set<int,_std::less<int>,_std::allocator<int>_> which_edge_ids_are_used;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  adj_list;
  vector<int,_std::allocator<int>_> local_178;
  vector<int,_std::allocator<int>_> local_158;
  uint local_13c;
  vector<bool,_std::allocator<bool>_> local_138;
  int local_10c;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *local_108;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> *local_100;
  long local_f8;
  _Base_ptr local_f0;
  int local_e8;
  int local_e4;
  int local_e0 [2];
  undefined4 local_d8 [2];
  undefined8 local_d0;
  undefined4 *local_c8;
  undefined4 *local_c0;
  undefined8 local_b8;
  set<int,_std::less<int>,_std::allocator<int>_> *local_b0;
  int_pair local_a8;
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  local_a0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_88;
  vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
  *local_58;
  long local_50;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_48;
  
  local_108 = antecedent_pattern_edges_ADDED;
  local_b0 = edges_occupied_by_antecedent;
  local_58 = edge_mapping_sets;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_48,&adjacency_list->adjacencyList);
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::vector(&local_a0,&adjacency_list->adjacencyEdgeInfo);
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88._M_impl.super__Rb_tree_header._M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e0[0] = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(&local_178,(iterator)0x0,local_e0);
  local_f0 = &(local_b0->_M_t)._M_impl.super__Rb_tree_header._M_header;
  iVar16 = 0;
  local_100 = from_pattern_id_to_adj_id_map;
  local_e8 = num_of_nondummy_nodes;
  do {
    if (debug) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"CURRENT INDEX: ",0xf);
      plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar16);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
    }
    uVar6 = ((long)(local_108->
                   super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(local_108->
                   super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    iVar15 = iVar16;
    if (uVar6 < (ulong)(long)iVar16 || uVar6 - (long)iVar16 == 0) {
      local_d8[0] = 0;
      local_d0 = 0;
      local_c8 = local_d8;
      local_b8 = 0;
      local_c0 = local_c8;
      if (local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        lVar17 = 9;
        uVar6 = 0;
        do {
          uVar10 = uVar6 + 0x3f;
          if (-1 < (long)uVar6) {
            uVar10 = uVar6;
          }
          if ((local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p
               [((long)uVar10 >> 6) +
                ((ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) - 1)] >> (uVar6 & 0x3f)
              & 1) == 0) {
            local_a8.first =
                 ((local_108->
                  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                  )._M_impl.super__Vector_impl_data._M_start)->_M_elems[lVar17];
            local_a8.second =
                 local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar6];
            std::
            _Rb_tree<dgrminer::int_pair,dgrminer::int_pair,std::_Identity<dgrminer::int_pair>,std::less<dgrminer::int_pair>,std::allocator<dgrminer::int_pair>>
            ::_M_insert_unique<dgrminer::int_pair_const&>
                      ((_Rb_tree<dgrminer::int_pair,dgrminer::int_pair,std::_Identity<dgrminer::int_pair>,std::less<dgrminer::int_pair>,std::allocator<dgrminer::int_pair>>
                        *)local_e0,&local_a8);
          }
          uVar6 = uVar6 + 1;
          lVar17 = lVar17 + 10;
        } while (uVar6 < (ulong)((long)local_158.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_158.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start >> 2));
      }
      std::
      vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
      ::push_back(local_58,(value_type *)local_e0);
      uVar6 = (ulong)local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset - 1;
      uVar10 = (ulong)local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset + 0x3e;
      if (-1 < (long)uVar6) {
        uVar10 = uVar6;
      }
      local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
      if ((local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p
           [((long)uVar10 >> 6) + ((ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) - 1)]
           >> (uVar6 & 0x3f) & 1) == 0) {
        pVar21 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                 ::equal_range(&local_88,
                               local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish + -1);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        _M_erase_aux(&local_88,(_Base_ptr)pVar21.first._M_node,(_Base_ptr)pVar21.second._M_node);
      }
      bVar4 = local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_offset == 0;
      local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset =
           local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset - 1;
      if (bVar4) {
        local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0x3f;
        local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p =
             local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p + -1;
      }
      local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
      std::
      _Rb_tree<dgrminer::int_pair,_dgrminer::int_pair,_std::_Identity<dgrminer::int_pair>,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>
      ::~_Rb_tree((_Rb_tree<dgrminer::int_pair,_dgrminer::int_pair,_std::_Identity<dgrminer::int_pair>,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>
                   *)local_e0);
      iVar15 = iVar16 + -1;
    }
    pvVar3 = local_108;
    local_e4 = iVar15;
    local_e0[0]._0_1_ =
         *(_Rb_tree<dgrminer::int_pair,dgrminer::int_pair,std::_Identity<dgrminer::int_pair>,std::less<dgrminer::int_pair>,std::allocator<dgrminer::int_pair>>
           *)((local_108->
              super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
              _M_impl.super__Vector_impl_data._M_start + iVar15);
    pmVar7 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
             operator[](from_pattern_id_to_adj_id_map,(key_type_conflict *)local_e0);
    iVar2 = *pmVar7;
    lVar17 = (long)iVar2;
    local_e0[0] = CONCAT31(local_e0[0]._1_3_,
                           (char)(pvVar3->
                                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[iVar15]._M_elems[1]);
    pmVar7 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
             operator[](from_pattern_id_to_adj_id_map,(key_type_conflict *)local_e0);
    iVar16 = local_e4;
    from_pattern_id_to_adj_id_map = local_100;
    uVar6 = (ulong)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar15];
    if (iVar2 < local_e8 && *pmVar7 < local_e8) {
      lVar18 = lVar17 * 3;
      piVar8 = local_48.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar17].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      lVar11 = (long)local_48.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar17].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_finish - (long)piVar8;
      local_13c = (uint)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
      if (uVar6 < (ulong)(lVar11 >> 2)) {
        local_13c = (uint)CONCAT71((int7)(lVar11 >> 10),1);
        local_10c = *pmVar7;
        local_f8 = lVar18;
        local_50 = lVar17;
        do {
          if (piVar8[uVar6] == local_10c) {
            if (debug) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"FOUND POSSIBLE EDGE ",0x14);
              this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)local_50);
              std::__ostream_insert<char,std::char_traits<char>>(this,", ",2);
              plVar5 = (long *)std::ostream::operator<<(this,local_10c);
              std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
              std::ostream::put((char)plVar5);
              std::ostream::flush();
            }
            bVar4 = is_adj_info_equal_to_pattern_edge
                              ((&((local_a0.
                                   super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)[lVar18] + uVar6,
                               (local_108->
                               super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + iVar16,true);
            piVar9 = (&((local_a0.
                         super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_start)[lVar18][uVar6]._M_elems + 7;
            p_Var14 = &local_88._M_impl.super__Rb_tree_header._M_header;
            if (local_88._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
              p_Var12 = local_88._M_impl.super__Rb_tree_header._M_header._M_parent;
              do {
                if (*piVar9 <= (int)*(size_t *)(p_Var12 + 1)) {
                  p_Var14 = p_Var12;
                }
                p_Var12 = (&p_Var12->_M_left)[(int)*(size_t *)(p_Var12 + 1) < *piVar9];
              } while (p_Var12 != (_Base_ptr)0x0);
            }
            p_Var1 = &local_88._M_impl.super__Rb_tree_header;
            p_Var13 = p_Var1;
            if (((_Rb_tree_header *)p_Var14 != p_Var1) &&
               (p_Var13 = (_Rb_tree_header *)p_Var14,
               *piVar9 < (int)((_Rb_tree_header *)p_Var14)->_M_node_count)) {
              p_Var13 = p_Var1;
            }
            p_Var14 = (local_b0->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var12 = local_f0;
            if (p_Var14 != (_Base_ptr)0x0) {
              do {
                if (*piVar9 <= (int)p_Var14[1]._M_color) {
                  p_Var12 = p_Var14;
                }
                p_Var14 = (&p_Var14->_M_left)[(int)p_Var14[1]._M_color < *piVar9];
              } while (p_Var14 != (_Base_ptr)0x0);
            }
            p_Var14 = local_f0;
            if ((p_Var12 != local_f0) && (p_Var14 = p_Var12, *piVar9 < (int)p_Var12[1]._M_color)) {
              p_Var14 = local_f0;
            }
            bVar19 = p_Var13 == &local_88._M_impl.super__Rb_tree_header;
            bVar20 = p_Var14 == local_f0;
            if ((bVar4 && bVar19) && bVar20) {
              if (debug) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"IT MATCHES",10);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
                std::ostream::put('p');
                std::ostream::flush();
              }
              local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar16] = (int)uVar6 + 1;
              local_e0[0] = 0;
              if (local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&local_178,
                           (iterator)
                           local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,local_e0);
              }
              else {
                *local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = 0;
                local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              std::vector<bool,_std::allocator<bool>_>::push_back(&local_138,false);
              piVar9 = (&((local_a0.
                           super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)[local_f8][uVar6]._M_elems + 7;
              if (local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_158,
                           (iterator)
                           local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,piVar9);
              }
              else {
                *local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = *piVar9;
                local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )&local_88,
                         (&((local_a0.
                             super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)[local_f8][uVar6]._M_elems + 7
                        );
              iVar16 = iVar16 + 1;
              local_13c = 0;
            }
            lVar18 = local_f8;
            if ((bVar4 && bVar19) && bVar20) break;
          }
          uVar6 = uVar6 + 1;
          piVar8 = (&((local_48.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                     _M_start)[lVar18];
        } while (uVar6 < (ulong)((long)(&((local_48.
                                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                         super__Vector_impl_data._M_finish)[lVar18] - (long)piVar8
                                >> 2));
      }
      from_pattern_id_to_adj_id_map = local_100;
      if (((local_13c & 1) != 0) &&
         (local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar16] != 0x7fffffff)) {
        local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar16] = 0x7fffffff;
        local_e0[0] = 0;
        if (local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_178,
                     (iterator)
                     local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,local_e0);
        }
        else {
          *local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = 0;
          local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        std::vector<bool,_std::allocator<bool>_>::push_back(&local_138,true);
        local_e0[0] = -1;
        if (local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_158,
                     (iterator)
                     local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,local_e0);
        }
        else {
LAB_00110fee:
          local_e0[0] = -1;
          *local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = -1;
          local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
LAB_00110ffd:
        iVar16 = iVar16 + 1;
      }
    }
    else if (local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[iVar15] != 0x7fffffff) {
      local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar15] = 0x7fffffff;
      local_e0[0] = 0;
      if (local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_178,
                   (iterator)
                   local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,local_e0);
      }
      else {
        *local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = 0;
        local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      std::vector<bool,_std::allocator<bool>_>::push_back(&local_138,true);
      local_e0[0] = -1;
      if (local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) goto LAB_00110fee;
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_158,
                 (iterator)
                 local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,local_e0);
      goto LAB_00110ffd;
    }
    if (iVar16 == 0) {
      iVar16 = 0;
    }
    else if (local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[iVar16] == 0x7fffffff) {
      uVar6 = (ulong)local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset - 1;
      uVar10 = (ulong)local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset + 0x3e;
      if (-1 < (long)uVar6) {
        uVar10 = uVar6;
      }
      local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
      if ((local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p
           [((long)uVar10 >> 6) + ((ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) - 1)]
           >> (uVar6 & 0x3f) & 1) == 0) {
        pVar21 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                 ::equal_range(&local_88,
                               local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish + -1);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        _M_erase_aux(&local_88,(_Base_ptr)pVar21.first._M_node,(_Base_ptr)pVar21.second._M_node);
      }
      bVar4 = local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_offset == 0;
      local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset =
           local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset - 1;
      if (bVar4) {
        local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0x3f;
        local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p =
             local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p + -1;
      }
      local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
      iVar16 = iVar16 + -1;
    }
    if ((iVar16 == 0) &&
       (*local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start == 0x7fffffff)) {
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_88);
      if (local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
        local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0;
        local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
      }
      if (local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::
      vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
      ::~vector(&local_a0);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_48);
      return;
    }
  } while( true );
}

Assistant:

void find_addition_edges(AdjacencyListCrate & adjacency_list, std::vector<std::array<int, PAT___SIZE>> & antecedent_pattern_edges_ADDED,
		std::map<char, int> & from_pattern_id_to_adj_id_map, int num_of_nondummy_nodes, std::vector<std::set<int_pair>> & edge_mapping_sets,
		std::set<int> & edges_occupied_by_antecedent, bool debug)
	{
		std::vector<std::vector<int>> adj_list = adjacency_list.adjacencyList;
		std::vector<std::vector<std::array<int, ADJ_INFO___SIZE>>> adj_more_info = adjacency_list.adjacencyEdgeInfo;

		int special_symbol_for_max_index = std::numeric_limits<int>::max();

		int number_of_created_dummy_edges = 0;

		int current_index = 0; // which of the antecedent_pattern_edges_ADDED are we currently processing

		std::vector<int> selected_ids_from_adj; // which IDS of adj nodes correspond to those in antecedent_pattern_isolated_node_id
		std::vector<bool> is_the_used_edge_dummy;
		std::vector<int> which_indices_should_be_used_next;

		std::set<int> which_edge_ids_are_used;

		which_indices_should_be_used_next.push_back(0); // for the first addition edge, we want to start from the first neighbor in the adjacency list

		// DO DFS:
		while (true)
		{

			if (debug) cout << "CURRENT INDEX: " << current_index << endl;
			// if all ADDITION edges were mapped:
			if (antecedent_pattern_edges_ADDED.size() <= current_index)
			{
                // WE FOUND ALL EDGES (pattern --> adjacency) antecedent_pattern_edges_ADDED[i][PAT_ID] --> selected_ids_from_adj[i]

				// save all pairs PATTERN_EDGE_ID->ADJ_EDGE_ID for non-dummy edges
				std::set<int_pair> edge_mapping_set;
				for (size_t i = 0; i < selected_ids_from_adj.size(); i++)
				{
					if (!is_the_used_edge_dummy[i])
					{
						int_pair edge_mapping_pair;
						edge_mapping_pair.first = antecedent_pattern_edges_ADDED[i][PAT_ID];
						edge_mapping_pair.second = selected_ids_from_adj[i];
						edge_mapping_set.insert(edge_mapping_pair);
					}
				}
				// now save this edge_mapping_set (then we check if it is not a subset of another mapping.. and remove all subsets of this mapping)
				edge_mapping_sets.push_back(edge_mapping_set);

				// AND BACKTRACK:

				bool was_the_edge_dummy = is_the_used_edge_dummy.back();

				which_indices_should_be_used_next.pop_back();
				if (was_the_edge_dummy)
				{
					number_of_created_dummy_edges--;
				}
				else
				{
					which_edge_ids_are_used.erase(selected_ids_from_adj.back());
				}

				is_the_used_edge_dummy.pop_back();
				selected_ids_from_adj.pop_back();
				current_index--;
			}

			int src_id = from_pattern_id_to_adj_id_map[antecedent_pattern_edges_ADDED[current_index][PAT_SRC_ID]];
			int dst_id = from_pattern_id_to_adj_id_map[antecedent_pattern_edges_ADDED[current_index][PAT_DST_ID]];
			// all non_dummy nodes have ID < num_of_nondummy_nodes, so we can check which nodes are dummy by:
			bool src_is_dummy = src_id >= num_of_nondummy_nodes;
			bool dst_is_dummy = dst_id >= num_of_nondummy_nodes;

			// if at least one node of the edge is dummy, then the edge itself is dummy
			if (src_is_dummy || dst_is_dummy)
			{
				// and if we didn't just try it as dummy:
				if (which_indices_should_be_used_next[current_index] != special_symbol_for_max_index)
				{
					// map it as dummy:
					which_indices_should_be_used_next[current_index] = special_symbol_for_max_index;
					which_indices_should_be_used_next.push_back(0);

					is_the_used_edge_dummy.push_back(true);

					selected_ids_from_adj.push_back(-1); // push there arbitrary number (the number is not used)

					number_of_created_dummy_edges++;

					current_index++;
				}
			}
			// if no node of the edge is dummy, then the edge itself can be dummy but doesn't have to be
			else
			{
				bool should_try_dummy = true;

				int src_index = which_indices_should_be_used_next[current_index];

				for (; src_index < adj_list[src_id].size(); src_index++)
				{
					if (adj_list[src_id][src_index] == dst_id)
					{
						if (debug) cout << "FOUND POSSIBLE EDGE " << src_id << ", " << dst_id << endl;
						bool matches = is_adj_info_equal_to_pattern_edge(adj_more_info[src_id][src_index], antecedent_pattern_edges_ADDED[current_index], true);
						bool was_already_used = which_edge_ids_are_used.find(adj_more_info[src_id][src_index][ADJ_INFO_ID]) != which_edge_ids_are_used.end();

						bool is_edge_occcupied = edges_occupied_by_antecedent.find(adj_more_info[src_id][src_index][ADJ_INFO_ID]) != edges_occupied_by_antecedent.end();

						if (matches && !was_already_used && !is_edge_occcupied)
						{
							if (debug) cout << "IT MATCHES" << endl;

							should_try_dummy = false;


							which_indices_should_be_used_next[current_index] = src_index + 1;
							which_indices_should_be_used_next.push_back(0);

							is_the_used_edge_dummy.push_back(false);
							selected_ids_from_adj.push_back(adj_more_info[src_id][src_index][ADJ_INFO_ID]);

							which_edge_ids_are_used.insert(adj_more_info[src_id][src_index][ADJ_INFO_ID]);
							current_index++;
							break;
						}
					}
				}


				// if we tried all regular edges and should backtrack, try to map to a dummy edge first:
				if (should_try_dummy && which_indices_should_be_used_next[current_index] != special_symbol_for_max_index)
				{
					//which_indices_should_be_used_next[current_index] = adj_list[from_id].size() + 1;
					which_indices_should_be_used_next[current_index] = special_symbol_for_max_index;
					which_indices_should_be_used_next.push_back(0);

					is_the_used_edge_dummy.push_back(true);

					selected_ids_from_adj.push_back(-1); // push there arbitrary number (the number is not used)

					number_of_created_dummy_edges++;

					current_index++;
				}
			}

			if (current_index != 0 && which_indices_should_be_used_next[current_index] == special_symbol_for_max_index)
			{
				// now we also tried the dummy one, so really backtrack
				bool was_the_edge_dummy = is_the_used_edge_dummy.back();

				which_indices_should_be_used_next.pop_back();
				if (was_the_edge_dummy)
				{
					number_of_created_dummy_edges--;
				}
				else
				{
					which_edge_ids_are_used.erase(selected_ids_from_adj.back());
				}

				is_the_used_edge_dummy.pop_back();
				selected_ids_from_adj.pop_back();
				current_index--;
			}

			if (current_index == 0 && which_indices_should_be_used_next[current_index] == special_symbol_for_max_index)
			{
				// we tried all combinations, just end:
				break;
			}

		}

	}